

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall
TorController::get_socks_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  pointer *ppbVar1;
  char cVar2;
  long lVar3;
  pointer pbVar4;
  size_type sVar5;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  Network NVar9;
  char *pcVar10;
  Logger *pLVar11;
  string *net_in;
  pointer this_00;
  long lVar12;
  char *pcVar13;
  long lVar14;
  pointer pbVar15;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view separators;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  pointer local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  _Any_data local_138;
  code *local_128;
  _Any_data local_118;
  code *local_108;
  string port_list_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_list;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  string socks_location;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  socks_location._M_dataplus._M_p = (pointer)&socks_location.field_2;
  socks_location._M_string_length = 0;
  socks_location.field_2._M_local_buf[0] = '\0';
  if (reply->code == 0x1fe) {
    pcVar10 = 
    "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    pcVar13 = (char *)0x17f;
LAB_00abd998:
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "get_socks_cb";
    logging_function_00._M_len = 0xc;
    ::LogPrintf_<>(logging_function_00,source_file_00,(int)pcVar13,ALL,Info,pcVar10);
  }
  else {
    if (reply->code == 0xfa) {
      pbVar15 = (reply->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (reply->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar10 = "tor: Get SOCKS port command returned nothing\n";
      pcVar13 = (char *)0x17c;
      if (pbVar15 != pbVar4) {
        do {
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(pbVar15,0,0x14,"net/listeners/socks=");
          if (iVar8 == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&port_list_str,pbVar15,0x14,0xffffffffffffffff);
            local_88._M_allocated_capacity =
                 CONCAT44(port_list_str._M_dataplus._M_p._4_4_,port_list_str._M_dataplus._M_p._0_4_)
            ;
            onlynets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
            separators._M_str = pcVar13;
            separators._M_len = (size_t)&onlynets;
            util::Split<std::__cxx11::string>
                      (&port_list,(util *)local_88._M_local_buf,(Span<const_char> *)0x1,separators);
            pbVar6 = port_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (this_00 = port_list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; this_00 != pbVar6;
                this_00 = this_00 + 1) {
              sVar5 = this_00->_M_string_length;
              if (sVar5 != 0) {
                pcVar10 = (this_00->_M_dataplus)._M_p;
                cVar2 = *pcVar10;
                if ((((cVar2 == '\'') || (cVar2 == '\"')) && (sVar5 != 1)) &&
                   (pcVar10[sVar5 - 1] == cVar2)) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_88,this_00,1,sVar5 - 2);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_88);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_allocated_capacity != local_78) {
                    operator_delete((void *)local_88._M_allocated_capacity,
                                    CONCAT44(local_78[0]._M_allocated_capacity._4_4_,
                                             (undefined4)local_78[0]._M_allocated_capacity) + 1);
                  }
                  if (this_00->_M_string_length == 0) goto LAB_00abd87a;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign(&socks_location,this_00);
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (this_00,0,10,"127.0.0.1:");
                if (iVar8 == 0) break;
              }
LAB_00abd87a:
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&port_list);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(port_list_str._M_dataplus._M_p._4_4_,
                            port_list_str._M_dataplus._M_p._0_4_) != &port_list_str.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(port_list_str._M_dataplus._M_p._4_4_,
                                       port_list_str._M_dataplus._M_p._0_4_),
                              CONCAT44(port_list_str.field_2._M_allocated_capacity._4_4_,
                                       port_list_str.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar4);
        pcVar10 = "tor: Get SOCKS port command returned nothing\n";
        pcVar13 = (char *)0x17c;
        local_158 = pbVar4;
        if (socks_location._M_string_length != 0) {
          pLVar11 = LogInstance();
          bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar11,TOR,Debug);
          if (bVar7) {
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
            ;
            source_file._M_len = 0x57;
            logging_function._M_str = "get_socks_cb";
            logging_function._M_len = 0xc;
            ::LogPrintf_<std::__cxx11::string>
                      (logging_function,source_file,0x17a,TOR,Debug,
                       "Get SOCKS port command yielded %s\n",&socks_location);
          }
          goto LAB_00abda03;
        }
      }
      goto LAB_00abd998;
    }
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_01._M_len = 0x57;
    logging_function_01._M_str = "get_socks_cb";
    logging_function_01._M_len = 0xc;
    LogPrintf_<int>(logging_function_01,source_file_01,0x181,ALL,Info,
                    "tor: Get SOCKS port command failed; error code %d\n",&reply->code);
  }
LAB_00abda03:
  CService::CService((CService *)&local_88);
  CNetAddr::IsValid((CNetAddr *)&local_88);
  if (socks_location._M_string_length != 0) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_118,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._M_pod_data[8] =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object = local_158;
    dns_lookup_function.super__Function_base._M_functor._9_7_ =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    dns_lookup_function.super__Function_base._M_manager =
         (_Manager_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    dns_lookup_function._M_invoker =
         (_Invoker_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    LookupNumeric((CService *)&port_list_str,&socks_location,0x235a,dns_lookup_function);
    if (0x10 < (uint)local_78[0]._0_4_) {
      free((void *)local_88._M_allocated_capacity);
    }
    local_88._M_allocated_capacity._4_4_ = port_list_str._M_dataplus._M_p._4_4_;
    local_88._M_allocated_capacity._0_4_ = port_list_str._M_dataplus._M_p._0_4_;
    local_78[0]._M_allocated_capacity._0_4_ = port_list_str.field_2._M_allocated_capacity._0_4_;
    port_list_str.field_2._M_allocated_capacity._0_4_ = 0;
    local_78[0]._8_8_ = port_list_str.field_2._8_8_;
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
  }
  bVar7 = CNetAddr::IsValid((CNetAddr *)&local_88);
  if (!bVar7) {
    ppbVar1 = &port_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    port_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"127.0.0.1","");
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_138,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._M_pod_data[8] =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object = local_158;
    dns_lookup_function_00.super__Function_base._M_functor._9_7_ =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    dns_lookup_function_00.super__Function_base._M_manager =
         (_Manager_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    dns_lookup_function_00._M_invoker =
         (_Invoker_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    LookupNumeric((CService *)&port_list_str,(string *)&port_list,0x235a,dns_lookup_function_00);
    if (0x10 < (uint)local_78[0]._0_4_) {
      free((void *)local_88._M_allocated_capacity);
    }
    local_88._M_allocated_capacity._4_4_ = port_list_str._M_dataplus._M_p._4_4_;
    local_88._M_allocated_capacity._0_4_ = port_list_str._M_dataplus._M_p._0_4_;
    local_78[0]._M_allocated_capacity._0_4_ = port_list_str.field_2._M_allocated_capacity._0_4_;
    port_list_str.field_2._M_allocated_capacity._0_4_ = 0;
    local_78[0]._8_8_ = port_list_str.field_2._8_8_;
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (port_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(port_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((port_list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  CNetAddr::IsValid((CNetAddr *)&local_88);
  pLVar11 = LogInstance();
  bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar11,TOR,Debug);
  if (bVar7) {
    CService::ToStringAddrPort_abi_cxx11_(&port_list_str,(CService *)&local_88);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_02._M_len = 0x57;
    logging_function_02._M_str = "get_socks_cb";
    logging_function_02._M_len = 0xc;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_02,399,TOR,Debug,"Configuring onion proxy for %s\n",
               &port_list_str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(port_list_str._M_dataplus._M_p._4_4_,port_list_str._M_dataplus._M_p._0_4_) !=
        &port_list_str.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(port_list_str._M_dataplus._M_p._4_4_,
                               port_list_str._M_dataplus._M_p._0_4_),
                      CONCAT44(port_list_str.field_2._M_allocated_capacity._4_4_,
                               port_list_str.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&port_list_str,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88);
  port_list_str.field_2._8_8_ = local_78[0]._8_8_;
  SetProxy(NET_ONION,(Proxy *)&port_list_str);
  ppbVar1 = &port_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  port_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"-onlynet","");
  ArgsManager::GetArgs(&onlynets,&gArgs,(string *)&port_list);
  if (port_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(port_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((port_list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  port_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"-onlynet","");
  bVar7 = ArgsManager::IsArgSet(&gArgs,(string *)&port_list);
  if (bVar7) {
    net_in = (string *)
             CONCAT71(onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar14 = (long)onlynets.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)net_in;
    if (0 < lVar14 >> 7) {
      lVar12 = (lVar14 >> 7) + 1;
      do {
        NVar9 = ParseNetwork(net_in);
        pbVar15 = net_in;
        if (NVar9 == NET_ONION) goto LAB_00abde38;
        NVar9 = ParseNetwork(net_in + 1);
        pbVar15 = net_in + 1;
        if (NVar9 == NET_ONION) goto LAB_00abde38;
        NVar9 = ParseNetwork(net_in + 2);
        pbVar15 = net_in + 2;
        if (NVar9 == NET_ONION) goto LAB_00abde38;
        NVar9 = ParseNetwork(net_in + 3);
        pbVar15 = net_in + 3;
        if (NVar9 == NET_ONION) goto LAB_00abde38;
        net_in = net_in + 4;
        lVar12 = lVar12 + -1;
        lVar14 = lVar14 + -0x80;
      } while (1 < lVar12);
    }
    lVar14 = lVar14 >> 5;
    if (lVar14 == 1) {
LAB_00abddfe:
      NVar9 = ParseNetwork(net_in);
      pbVar15 = net_in;
      if (NVar9 != NET_ONION) {
        pbVar15 = onlynets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar14 == 2) {
LAB_00abdded:
      NVar9 = ParseNetwork(net_in);
      pbVar15 = net_in;
      if (NVar9 != NET_ONION) {
        net_in = net_in + 1;
        goto LAB_00abddfe;
      }
    }
    else {
      pbVar15 = onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar14 == 3) && (NVar9 = ParseNetwork(net_in), pbVar15 = net_in, NVar9 != NET_ONION)) {
        net_in = net_in + 1;
        goto LAB_00abdded;
      }
    }
LAB_00abde38:
    if (port_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(port_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((port_list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (pbVar15 ==
        onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00abde6b;
  }
  else if (port_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(port_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((port_list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  ReachableNets::Add(&g_reachable_nets,NET_ONION);
LAB_00abde6b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
  if (0x10 < (uint)port_list_str.field_2._M_allocated_capacity._0_4_) {
    free((void *)CONCAT44(port_list_str._M_dataplus._M_p._4_4_,port_list_str._M_dataplus._M_p._0_4_)
        );
  }
  if (0x10 < (uint)local_78[0]._0_4_) {
    free((void *)local_88._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)socks_location._M_dataplus._M_p != &socks_location.field_2) {
    operator_delete(socks_location._M_dataplus._M_p,
                    CONCAT71(socks_location.field_2._M_allocated_capacity._1_7_,
                             socks_location.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::get_socks_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    // NOTE: We can only get here if -onion is unset
    std::string socks_location;
    if (reply.code == 250) {
        for (const auto& line : reply.lines) {
            if (0 == line.compare(0, 20, "net/listeners/socks=")) {
                const std::string port_list_str = line.substr(20);
                std::vector<std::string> port_list = SplitString(port_list_str, ' ');

                for (auto& portstr : port_list) {
                    if (portstr.empty()) continue;
                    if ((portstr[0] == '"' || portstr[0] == '\'') && portstr.size() >= 2 && (*portstr.rbegin() == portstr[0])) {
                        portstr = portstr.substr(1, portstr.size() - 2);
                        if (portstr.empty()) continue;
                    }
                    socks_location = portstr;
                    if (0 == portstr.compare(0, 10, "127.0.0.1:")) {
                        // Prefer localhost - ignore other ports
                        break;
                    }
                }
            }
        }
        if (!socks_location.empty()) {
            LogDebug(BCLog::TOR, "Get SOCKS port command yielded %s\n", socks_location);
        } else {
            LogPrintf("tor: Get SOCKS port command returned nothing\n");
        }
    } else if (reply.code == 510) {  // 510 Unrecognized command
        LogPrintf("tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n");
    } else {
        LogPrintf("tor: Get SOCKS port command failed; error code %d\n", reply.code);
    }

    CService resolved;
    Assume(!resolved.IsValid());
    if (!socks_location.empty()) {
        resolved = LookupNumeric(socks_location, DEFAULT_TOR_SOCKS_PORT);
    }
    if (!resolved.IsValid()) {
        // Fallback to old behaviour
        resolved = LookupNumeric("127.0.0.1", DEFAULT_TOR_SOCKS_PORT);
    }

    Assume(resolved.IsValid());
    LogDebug(BCLog::TOR, "Configuring onion proxy for %s\n", resolved.ToStringAddrPort());
    Proxy addrOnion = Proxy(resolved, true);
    SetProxy(NET_ONION, addrOnion);

    const auto onlynets = gArgs.GetArgs("-onlynet");

    const bool onion_allowed_by_onlynet{
        !gArgs.IsArgSet("-onlynet") ||
        std::any_of(onlynets.begin(), onlynets.end(), [](const auto& n) {
            return ParseNetwork(n) == NET_ONION;
        })};

    if (onion_allowed_by_onlynet) {
        // If NET_ONION is reachable, then the below is a noop.
        //
        // If NET_ONION is not reachable, then none of -proxy or -onion was given.
        // Since we are here, then -torcontrol and -torpassword were given.
        g_reachable_nets.Add(NET_ONION);
    }
}